

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

void __thiscall
spirv_cross::SmallVector<spirv_cross::Instruction,_8UL>::reserve
          (SmallVector<spirv_cross::Instruction,_8UL> *this,size_t count)

{
  Instruction *pIVar1;
  ulong uVar2;
  Instruction *pIVar3;
  long lVar4;
  ulong uVar5;
  
  if (count < 0x1555555555555556) {
    uVar2 = this->buffer_capacity;
    if (uVar2 < count) {
      uVar5 = 8;
      if (8 < uVar2) {
        uVar5 = uVar2;
      }
      do {
        uVar2 = uVar5;
        uVar5 = uVar2 * 2;
      } while (uVar2 < count);
      if (uVar2 < 9) {
        pIVar3 = (Instruction *)&this->stack_storage;
      }
      else {
        pIVar3 = (Instruction *)malloc(uVar2 * 0xc);
      }
      if (pIVar3 == (Instruction *)0x0) goto LAB_003a3b22;
      if ((pIVar3 != (this->super_VectorView<spirv_cross::Instruction>).ptr) &&
         ((this->super_VectorView<spirv_cross::Instruction>).buffer_size != 0)) {
        lVar4 = 0;
        uVar5 = 0;
        do {
          pIVar1 = (this->super_VectorView<spirv_cross::Instruction>).ptr;
          *(undefined4 *)((long)&pIVar3->length + lVar4) =
               *(undefined4 *)((long)&pIVar1->length + lVar4);
          *(undefined8 *)((long)&pIVar3->op + lVar4) = *(undefined8 *)((long)&pIVar1->op + lVar4);
          uVar5 = uVar5 + 1;
          lVar4 = lVar4 + 0xc;
        } while (uVar5 < (this->super_VectorView<spirv_cross::Instruction>).buffer_size);
      }
      pIVar1 = (this->super_VectorView<spirv_cross::Instruction>).ptr;
      if (pIVar1 != (Instruction *)&this->stack_storage) {
        free(pIVar1);
      }
      (this->super_VectorView<spirv_cross::Instruction>).ptr = pIVar3;
      this->buffer_capacity = uVar2;
    }
    return;
  }
LAB_003a3b22:
  ::std::terminate();
}

Assistant:

void reserve(size_t count) SPIRV_CROSS_NOEXCEPT
	{
		if ((count > (std::numeric_limits<size_t>::max)() / sizeof(T)) ||
		    (count > (std::numeric_limits<size_t>::max)() / 2))
		{
			// Only way this should ever happen is with garbage input, terminate.
			std::terminate();
		}

		if (count > buffer_capacity)
		{
			size_t target_capacity = buffer_capacity;
			if (target_capacity == 0)
				target_capacity = 1;

			// Weird parens works around macro issues on Windows if NOMINMAX is not used.
			target_capacity = (std::max)(target_capacity, N);

			// Need to ensure there is a POT value of target capacity which is larger than count,
			// otherwise this will overflow.
			while (target_capacity < count)
				target_capacity <<= 1u;

			T *new_buffer =
			    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

			// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
			if (!new_buffer)
				std::terminate();

			// In case for some reason two allocations both come from same stack.
			if (new_buffer != this->ptr)
			{
				// We don't deal with types which can throw in move constructor.
				for (size_t i = 0; i < this->buffer_size; i++)
				{
					new (&new_buffer[i]) T(std::move(this->ptr[i]));
					this->ptr[i].~T();
				}
			}

			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = new_buffer;
			buffer_capacity = target_capacity;
		}
	}